

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
 __thiscall hedg::utils::new_streamer(utils *this,io_service *service,context *context)

{
  Client<hedg::Stream_Client> *this_00;
  pointer __p;
  system_error e;
  __uniq_ptr_impl<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
  local_60 [8];
  
  *(undefined8 *)this = 0;
  this_00 = (Client<hedg::Stream_Client> *)operator_new(0x2e8);
  Client<hedg::Stream_Client>::Client
            (this_00,(string *)&config::stream_host_abi_cxx11_,
             (string *)config::stream_port_abi_cxx11_,service,context);
  local_60[0]._M_t.
  super__Tuple_impl<0UL,_hedg::Client<hedg::Stream_Client>_*,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
  .super__Head_base<0UL,_hedg::Client<hedg::Stream_Client>_*,_false>._M_head_impl =
       (tuple<hedg::Client<hedg::Stream_Client>_*,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
        )(_Tuple_impl<0UL,_hedg::Client<hedg::Stream_Client>_*,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
          )0x0;
  std::
  __uniq_ptr_impl<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
  ::reset((__uniq_ptr_impl<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
           *)this,this_00);
  std::
  unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
  ::~unique_ptr((unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
                 *)local_60);
  return (__uniq_ptr_data<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>,_true,_true>
          )(__uniq_ptr_data<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr < Client < Stream_Client> > new_streamer(io_service& service, ssl::context& context) {
		
		std::unique_ptr<Client<Stream_Client> > streamer;
		try {
			streamer = std::move(std::unique_ptr<Client<Stream_Client>>(new Client<Stream_Client>{ config::stream_host, config::stream_port, service, context }));
		}
		catch (boost::system::system_error e) {
			spdlog::error(e.what());
		}	
		return streamer;
	}